

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

bool __thiscall soplex::SPxSolverBase<double>::noViols(SPxSolverBase<double> *this,double tol)

{
  double dVar1;
  Type TVar2;
  int iVar3;
  double *pdVar4;
  SPxSolverBase<double> *in_RDI;
  double in_XMM0_Qa;
  int i_2;
  int i_1;
  int i;
  double in_stack_ffffffffffffff88;
  int n;
  VectorBase<double> *in_stack_ffffffffffffff90;
  int local_24;
  int local_20;
  int local_1c;
  
  TVar2 = type(in_RDI);
  if (TVar2 == ENTER) {
    for (local_1c = 0; iVar3 = dim((SPxSolverBase<double> *)0x21c3d1), local_1c < iVar3;
        local_1c = local_1c + 1) {
      pdVar4 = VectorBase<double>::operator[]
                         (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20))
      ;
      dVar1 = *pdVar4;
      pdVar4 = VectorBase<double>::operator[]
                         (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20))
      ;
      if (in_XMM0_Qa < dVar1 - *pdVar4) {
        return false;
      }
      pdVar4 = VectorBase<double>::operator[]
                         (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20))
      ;
      dVar1 = *pdVar4;
      pdVar4 = VectorBase<double>::operator[]
                         (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20))
      ;
      if (in_XMM0_Qa < dVar1 - *pdVar4) {
        return false;
      }
    }
  }
  else {
    for (local_20 = 0; iVar3 = dim((SPxSolverBase<double> *)0x21c4b3), local_20 < iVar3;
        local_20 = local_20 + 1) {
      pdVar4 = VectorBase<double>::operator[]
                         (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20))
      ;
      dVar1 = *pdVar4;
      pdVar4 = VectorBase<double>::operator[]
                         (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20))
      ;
      if (in_XMM0_Qa < dVar1 - *pdVar4) {
        return false;
      }
      pdVar4 = VectorBase<double>::operator[]
                         (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20))
      ;
      dVar1 = *pdVar4;
      pdVar4 = VectorBase<double>::operator[]
                         (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20))
      ;
      if (in_XMM0_Qa < dVar1 - *pdVar4) {
        return false;
      }
    }
    local_24 = 0;
    while( true ) {
      n = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
      iVar3 = coDim((SPxSolverBase<double> *)0x21c593);
      if (iVar3 <= local_24) break;
      pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffff90,n);
      in_stack_ffffffffffffff90 = (VectorBase<double> *)*pdVar4;
      pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffff90,n);
      if (in_XMM0_Qa < (double)in_stack_ffffffffffffff90 - *pdVar4) {
        return false;
      }
      pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffff90,n);
      in_stack_ffffffffffffff88 = *pdVar4;
      pdVar4 = VectorBase<double>::operator[]
                         (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20))
      ;
      if (in_XMM0_Qa < in_stack_ffffffffffffff88 - *pdVar4) {
        return false;
      }
      local_24 = local_24 + 1;
    }
  }
  return true;
}

Assistant:

bool SPxSolverBase<R>::noViols(R tol) const
   {
      assert(tol >= R(0.0));

      if(type() == ENTER)
      {
         for(int i = 0; i < dim(); i++)
         {
            if((*theFvec)[i] - theUBbound[i] > tol)
               return false;

            if(theLBbound[i] - (*theFvec)[i] > tol)
               return false;
         }
      }
      else
      {
         assert(type() == LEAVE);

         for(int i = 0; i < dim(); i++)
         {
            if((*theCoPvec)[i] - (*theCoUbound)[i] > tol)
               return false;

            if((*theCoLbound)[i] - (*theCoPvec)[i] > tol)
               return false;
         }

         for(int i = 0; i < coDim(); i++)
         {
            if((*thePvec)[i] - (*theUbound)[i] > tol)
               return false;

            if((*theLbound)[i] - (*thePvec)[i] > tol)
               return false;
         }
      }

      return true;
   }